

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O2

void __thiscall
pstore::json::details::string_matcher<pstore::json::null_output>::string_matcher
          (string_matcher<pstore::json::null_output> *this,
          not_null<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
          str,bool object_key)

{
  (this->super_matcher<pstore::json::null_output>).state_ = 2;
  (this->super_matcher<pstore::json::null_output>)._vptr_matcher =
       (_func_int **)&PTR__matcher_001b5398;
  (this->super_matcher<pstore::json::null_output>).field_0xc = object_key;
  (this->decoder_).codepoint_ = L'\0';
  (this->decoder_).state_ = '\0';
  (this->decoder_).well_formed_ = true;
  (this->app_).result_.ptr_ = str.ptr_;
  (this->app_).high_surrogate_ = L'\0';
  this->hex_ = 0;
  (str.ptr_)->_M_string_length = 0;
  *((str.ptr_)->_M_dataplus)._M_p = '\0';
  return;
}

Assistant:

explicit constexpr matcher (int const initial_state) noexcept
                        : state_{initial_state} {}